

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

bool __thiscall
SVGChart::BarDataDrawer::DrawData
          (BarDataDrawer *this,PlotDataBase *inXData,PlotDataBase *inYData,
          PlotDataSelection *inPlotDataSelection,AxisSetup *inXAxisSetup,PRect *inRect,
          Painter *inPainter)

{
  Trafo *pTVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long theI;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  
  if (((this->super_DataDrawerBase).mXTrafo == (Trafo *)0x0) ||
     ((this->super_DataDrawerBase).mYTrafo == (Trafo *)0x0)) {
    bVar2 = false;
  }
  else {
    lVar4 = PlotDataBase::GetSize(inXData);
    lVar5 = PlotDataBase::GetSize(inYData);
    bVar2 = false;
    if ((lVar4 <= lVar5) && (bVar2 = false, (this->super_DataDrawerBase).mPlotCount != 0)) {
      if ((this->super_DataDrawerBase).field_0x24 == '\x01') {
        iVar3 = (*(this->super_DataDrawerBase)._vptr_DataDrawerBase[4])
                          (this,inXData,inYData,inPlotDataSelection,inXAxisSetup,inRect);
        return SUB41(iVar3,0);
      }
      (*((this->super_DataDrawerBase).mYTrafo)->_vptr_Trafo[2])(0);
      lVar4 = inRect->mW;
      lVar5 = PlotDataBase::GetSize(inXData);
      uVar6 = lVar4 / lVar5;
      lVar4 = 0;
      while( true ) {
        lVar5 = PlotDataBase::GetSize(inXData);
        if (lVar5 <= lVar4) break;
        pTVar1 = (this->super_DataDrawerBase).mXTrafo;
        PlotDataBase::GetValue(inXData,lVar4);
        (*pTVar1->_vptr_Trafo[2])(pTVar1);
        pTVar1 = (this->super_DataDrawerBase).mYTrafo;
        PlotDataBase::GetValue(inYData,lVar4);
        (*pTVar1->_vptr_Trafo[2])(pTVar1);
        (*inPainter->_vptr_Painter[1])
                  (inPainter,
                   (ulong)(uint)((int)extraout_XMM0_Da_00 +
                                (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 |
                                            uVar6 & 0xffffffff) / -2)),
                   (ulong)(uint)(int)extraout_XMM0_Da_01,uVar6,
                   (ulong)(uint)((int)extraout_XMM0_Da - (int)extraout_XMM0_Da_01));
        lVar4 = lVar4 + 1;
      }
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool BarDataDrawer::DrawData (const PlotDataBase &inXData, const PlotDataBase &inYData, const PlotDataSelection &inPlotDataSelection, const AxisSetup &inXAxisSetup, const PRect &inRect, Painter &inPainter) const {
      if (!mXTrafo || !mYTrafo) {
        return false;
      }
      if (inXData.GetSize ()>inYData.GetSize ()) {
        return false;
      }
      if (!mPlotCount) {
          return false;
      }
      if (mDrawOnlyLastPoint) {
        return DrawOnlyLastPoint (inXData, inYData, inPlotDataSelection, inXAxisSetup, inRect, inPainter);
      }

      int theTraX, theTraY;
      int theTraY0 = mYTrafo->Transform (0);

      int theLeft, theTop, theWidth, theHeight;

      theWidth = inRect.mW/inXData.GetSize ();
      
      for (long theI=0;theI<inXData.GetSize ();theI++) {
        theTraX = mXTrafo->Transform (inXData.GetValue (theI));
        theTraY = mYTrafo->Transform (inYData.GetValue (theI));

        theLeft = theTraX-theWidth/2;
        theTop = theTraY;
        theHeight = theTraY0-theTop;

        inPainter.FillRect (theLeft, theTop, theWidth, theHeight);
      }
      return true;
    }